

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u16 cellSizePtr(MemPage *pPage,u8 *pCell)

{
  byte bVar1;
  ushort uVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  u8 *puVar7;
  ulong uVar8;
  ulong uVar9;
  
  puVar7 = pCell + pPage->childPtrSize;
  bVar1 = pCell[pPage->childPtrSize];
  uVar4 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    uVar4 = bVar1 & 0x7f;
    uVar8 = 0;
    do {
      lVar3 = uVar8 + 1;
      uVar9 = uVar8 + 1;
      uVar4 = puVar7[lVar3] & 0x7f | uVar4 << 7;
      if (6 < uVar8) break;
      uVar8 = uVar9;
    } while ((char)puVar7[lVar3] < '\0');
    puVar7 = puVar7 + uVar9;
  }
  iVar5 = (int)puVar7 + 1;
  if (pPage->maxLocal < uVar4) {
    uVar2 = pPage->minLocal;
    uVar4 = (uVar4 - uVar2) % (pPage->pBt->usableSize - 4) + (uint)uVar2;
    if (pPage->maxLocal < uVar4) {
      uVar4 = (uint)uVar2;
    }
    uVar6 = (iVar5 - (int)pCell) + uVar4 + 4;
  }
  else {
    uVar4 = uVar4 + (iVar5 - (int)pCell);
    uVar6 = 4;
    if (4 < uVar4) {
      uVar6 = uVar4;
    }
  }
  return (u16)uVar6;
}

Assistant:

static u16 cellSizePtr(MemPage *pPage, u8 *pCell){
  u8 *pIter = pCell + pPage->childPtrSize; /* For looping over bytes of pCell */
  u8 *pEnd;                                /* End mark for a varint */
  u32 nSize;                               /* Size value to return */

#ifdef SQLITE_DEBUG
  /* The value returned by this function should always be the same as
  ** the (CellInfo.nSize) value found by doing a full parse of the
  ** cell. If SQLITE_DEBUG is defined, an assert() at the bottom of
  ** this function verifies that this invariant is not violated. */
  CellInfo debuginfo;
  pPage->xParseCell(pPage, pCell, &debuginfo);
#endif

  nSize = *pIter;
  if( nSize>=0x80 ){
    pEnd = &pIter[8];
    nSize &= 0x7f;
    do{
      nSize = (nSize<<7) | (*++pIter & 0x7f);
    }while( *(pIter)>=0x80 && pIter<pEnd );
  }
  pIter++;
  testcase( nSize==pPage->maxLocal );
  testcase( nSize==(u32)pPage->maxLocal+1 );
  if( nSize<=pPage->maxLocal ){
    nSize += (u32)(pIter - pCell);
    if( nSize<4 ) nSize = 4;
  }else{
    int minLocal = pPage->minLocal;
    nSize = minLocal + (nSize - minLocal) % (pPage->pBt->usableSize - 4);
    testcase( nSize==pPage->maxLocal );
    testcase( nSize==(u32)pPage->maxLocal+1 );
    if( nSize>pPage->maxLocal ){
      nSize = minLocal;
    }
    nSize += 4 + (u16)(pIter - pCell);
  }
  assert( nSize==debuginfo.nSize || CORRUPT_DB );
  return (u16)nSize;
}